

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

string * pstore::path::win32::join
                   (string *__return_storage_ptr__,string *path,
                   initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *paths)

{
  size_type sVar1;
  size_t sVar2;
  int iVar3;
  int iVar4;
  long *plVar5;
  size_type *psVar6;
  long lVar7;
  string *psVar8;
  iterator path_00;
  string result_path;
  string result_drive;
  string p_drive;
  string p_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  char *local_c0;
  size_t local_b8;
  char local_b0;
  undefined7 uStack_af;
  char *local_a0;
  char *local_98;
  long local_90;
  char local_88;
  undefined7 uStack_87;
  undefined1 local_78 [32];
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  string *local_38;
  
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  local_e0._M_string_length = 0;
  local_e0.field_2._M_local_buf[0] = '\0';
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  local_100._M_string_length = 0;
  local_100.field_2._M_local_buf[0] = '\0';
  split_drive((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_78,path);
  std::__cxx11::string::operator=((string *)&local_e0,(string *)local_78);
  std::__cxx11::string::operator=((string *)&local_100,(string *)&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
  }
  local_38 = __return_storage_ptr__;
  if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  if (paths->_M_len != 0) {
    path_00 = paths->_M_array;
    lVar7 = paths->_M_len << 5;
    local_a0 = "p_drive.length () == 2 && p_drive[1] == \':\'";
    do {
      local_c0 = &local_b0;
      local_98 = &local_88;
      local_b8 = 0;
      local_b0 = '\0';
      local_90 = 0;
      local_88 = '\0';
      split_drive((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_78,path_00);
      std::__cxx11::string::operator=((string *)&local_c0,(string *)local_78);
      std::__cxx11::string::operator=((string *)&local_98,(string *)&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_p != &local_48) {
        operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
        operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
      }
      sVar2 = local_b8;
      sVar1 = local_e0._M_string_length;
      if ((local_90 == 0) || ((*local_98 != '\\' && (*local_98 != '/')))) {
        if ((local_b8 != 0) &&
           ((local_b8 != local_e0._M_string_length ||
            (iVar3 = bcmp(local_c0,local_e0._M_dataplus._M_p,local_b8), iVar3 != 0)))) {
          iVar3 = 0x8c;
          if ((sVar2 != 2) || (local_c0[1] != ':')) {
LAB_00122732:
            assert_failed(local_a0,
                          "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/os/path.cpp"
                          ,iVar3);
          }
          if (sVar1 != 0) {
            iVar3 = 0x8e;
            if ((sVar1 != 2) || (local_e0._M_dataplus._M_p[1] != ':')) {
              local_a0 = 
              "result_drive.length () == 0 || (result_drive.length () == 2 && result_drive[1] == \':\')"
              ;
              goto LAB_00122732;
            }
            iVar3 = tolower((int)*local_c0);
            iVar4 = tolower((int)*local_e0._M_dataplus._M_p);
            if (iVar3 == iVar4) {
              std::__cxx11::string::_M_assign((string *)&local_e0);
              goto LAB_0012251d;
            }
          }
          goto LAB_00122560;
        }
LAB_0012251d:
        if (((local_100._M_string_length != 0) &&
            (local_100._M_dataplus._M_p[local_100._M_string_length - 1] != '/')) &&
           (local_100._M_dataplus._M_p[local_100._M_string_length - 1] != '\\')) {
          std::__cxx11::string::push_back('\0');
        }
        std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_98);
      }
      else {
        if ((local_b8 != 0) || (local_e0._M_string_length == 0)) {
LAB_00122560:
          std::__cxx11::string::_M_assign((string *)&local_e0);
        }
        std::__cxx11::string::_M_assign((string *)&local_100);
      }
      if (local_98 != &local_88) {
        operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
      }
      if (local_c0 != &local_b0) {
        operator_delete(local_c0,CONCAT71(uStack_af,local_b0) + 1);
      }
      path_00 = path_00 + 1;
      lVar7 = lVar7 + -0x20;
    } while (lVar7 != 0);
  }
  psVar8 = local_38;
  if (((local_100._M_string_length == 0) || (*local_100._M_dataplus._M_p == '/')) ||
     ((*local_100._M_dataplus._M_p == '\\' ||
      ((local_e0._M_string_length == 0 ||
       (local_e0._M_dataplus._M_p[local_e0._M_string_length - 1] == ':')))))) {
    std::operator+(local_38,&local_e0,&local_100);
  }
  else {
    local_78._0_8_ = local_78 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_78,local_e0._M_dataplus._M_p,
               local_e0._M_dataplus._M_p + local_e0._M_string_length);
    psVar8 = local_38;
    std::__cxx11::string::_M_replace_aux((ulong)local_78,local_78._8_8_,0,'\x01');
    plVar5 = (long *)std::__cxx11::string::_M_append(local_78,(ulong)local_100._M_dataplus._M_p);
    (psVar8->_M_dataplus)._M_p = (pointer)&psVar8->field_2;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar6) {
      lVar7 = plVar5[3];
      (psVar8->field_2)._M_allocated_capacity = *psVar6;
      *(long *)((long)&psVar8->field_2 + 8) = lVar7;
    }
    else {
      (psVar8->_M_dataplus)._M_p = (pointer)*plVar5;
      (psVar8->field_2)._M_allocated_capacity = *psVar6;
    }
    psVar8->_M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
      operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,
                    CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                             local_100.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,
                    CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                             local_e0.field_2._M_local_buf[0]) + 1);
  }
  return psVar8;
}

Assistant:

std::string join (std::string const & path,
                              std::initializer_list<std::string> const & paths) {
                auto is_path_sep = [] (char const c) { return c == '/' || c == '\\'; };

                std::string result_drive;
                std::string result_path;
                std::tie (result_drive, result_path) = split_drive (path);

                for (auto const & p : paths) {
                    std::string p_drive;
                    std::string p_path;
                    std::tie (p_drive, p_path) = split_drive (p);

                    if (!p_path.empty () && is_path_sep (p_path[0])) {
                        // The second path is absolute
                        if (!p_drive.empty () || result_drive.empty ()) {
                            result_drive = p_drive;
                        }

                        result_path = p_path;
                        continue;
                    }

                    if (!p_drive.empty () && p_drive != result_drive) {
                        PSTORE_ASSERT (p_drive.length () == 2 && p_drive[1] == ':');
                        PSTORE_ASSERT (result_drive.length () == 0 ||
                                       (result_drive.length () == 2 && result_drive[1] == ':'));

                        if (result_drive.length () == 0 ||
                            std::tolower (p_drive[0]) != std::tolower (result_drive[0])) {
                            // Different drives so ignore the first path entirely
                            result_drive = p_drive;
                            result_path = p_path;
                            continue;
                        }

                        // Same drive in different case
                        result_drive = p_drive;
                    }

                    // Second path is relative to the first
                    if (!result_path.empty () && !is_path_sep (result_path.back ())) {
                        result_path += '\\';
                    }
                    result_path += p_path;
                }

                // Add separator between UNC and non-absolute path
                if (!result_path.empty () && !is_path_sep (result_path[0]) &&
                    !result_drive.empty () && result_drive.back () != ':') {

                    return result_drive + '\\' + result_path;
                }

                return result_drive + result_path;
            }